

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

lys_module *
lys_get_import_module(lys_module *module,char *prefix,int pref_len,char *name,int name_len)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  lys_module *plVar5;
  LY_ERR *pLVar6;
  long lVar7;
  
  if (name != (char *)0x0 && prefix != (char *)0x0) {
    __assert_fail("!prefix || !name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x9e5,
                  "const struct lys_module *lys_get_import_module(const struct lys_module *, const char *, int, const char *, int)"
                 );
  }
  if (pref_len == 0 && prefix != (char *)0x0) {
    sVar3 = strlen(prefix);
    pref_len = (int)sVar3;
  }
  if (name_len == 0 && name != (char *)0x0) {
    sVar3 = strlen(name);
    name_len = (int)sVar3;
  }
  if (module == (lys_module *)0x0) {
    plVar5 = (lys_module *)0x0;
  }
  else {
    plVar5 = module;
    if ((module->field_0x40 & 1) != 0) {
      plVar5 = (lys_module *)module->data;
    }
  }
  sVar3 = (size_t)name_len;
  if (prefix != (char *)0x0) {
    bVar1 = module->field_0x40;
    if ((bVar1 & 1) == 0) {
      pcVar4 = plVar5->prefix;
      iVar2 = strncmp(pcVar4,prefix,(long)pref_len);
      if ((iVar2 == 0) && (pcVar4[pref_len] == '\0')) goto LAB_0015840d;
      if ((bVar1 & 1) == 0) goto LAB_00158440;
    }
    pcVar4 = module->prefix;
    iVar2 = strncmp(pcVar4,prefix,(long)pref_len);
    if ((iVar2 != 0) || (pcVar4[pref_len] != '\0')) goto LAB_00158440;
  }
LAB_0015840d:
  if (name == (char *)0x0) {
    return plVar5;
  }
  pcVar4 = plVar5->name;
  iVar2 = strncmp(pcVar4,name,sVar3);
  if ((iVar2 == 0) && (pcVar4[sVar3] == '\0')) {
    return plVar5;
  }
LAB_00158440:
  bVar1 = module->imp_size;
  if ((ulong)bVar1 != 0) {
    lVar7 = 0;
    do {
      if (prefix == (char *)0x0) {
LAB_00158493:
        if (name == (char *)0x0) {
LAB_0015850d:
          return *(lys_module **)(module->imp->rev + lVar7 + -0x10);
        }
        pcVar4 = *(char **)(*(long *)(module->imp->rev + lVar7 + -0x10) + 8);
        iVar2 = strncmp(pcVar4,name,sVar3);
        if ((iVar2 == 0) && (pcVar4[sVar3] == '\0')) goto LAB_0015850d;
      }
      else {
        pcVar4 = *(char **)(module->imp->rev + lVar7 + -8);
        iVar2 = strncmp(pcVar4,prefix,(long)pref_len);
        if ((iVar2 == 0) && (pcVar4[pref_len] == '\0')) goto LAB_00158493;
      }
      lVar7 = lVar7 + 0x38;
    } while ((ulong)bVar1 * 0x38 - lVar7 != 0);
  }
  if (name == (char *)0x0) {
    plVar5 = (lys_module *)0x0;
  }
  else {
    pcVar4 = strndup(name,sVar3);
    if (pcVar4 == (char *)0x0) {
      pLVar6 = ly_errno_location();
      *pLVar6 = LY_EMEM;
      plVar5 = (lys_module *)0x0;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_get_import_module");
    }
    else {
      plVar5 = ly_ctx_get_module(module->ctx,pcVar4,(char *)0x0);
      free(pcVar4);
    }
  }
  return plVar5;
}

Assistant:

const struct lys_module *
lys_get_import_module(const struct lys_module *module, const char *prefix, int pref_len, const char *name, int name_len)
{
    const struct lys_module *main_module;
    char *str;
    int i;

    assert(!prefix || !name);

    if (prefix && !pref_len) {
        pref_len = strlen(prefix);
    }
    if (name && !name_len) {
        name_len = strlen(name);
    }

    main_module = lys_main_module(module);

    /* module own prefix, submodule own prefix, (sub)module own name */
    if ((!prefix || (!module->type && !strncmp(main_module->prefix, prefix, pref_len) && !main_module->prefix[pref_len])
                 || (module->type && !strncmp(module->prefix, prefix, pref_len) && !module->prefix[pref_len]))
            && (!name || (!strncmp(main_module->name, name, name_len) && !main_module->name[name_len]))) {
        return main_module;
    }

    /* standard import */
    for (i = 0; i < module->imp_size; ++i) {
        if ((!prefix || (!strncmp(module->imp[i].prefix, prefix, pref_len) && !module->imp[i].prefix[pref_len]))
                && (!name || (!strncmp(module->imp[i].module->name, name, name_len) && !module->imp[i].module->name[name_len]))) {
            return module->imp[i].module;
        }
    }

    /* module required by a foreign grouping, deviation, or submodule */
    if (name) {
        str = strndup(name, name_len);
        if (!str) {
            LOGMEM;
            return NULL;
        }
        main_module = ly_ctx_get_module(module->ctx, str, NULL);
        free(str);
        return main_module;
    }

    return NULL;
}